

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O3

void pstrcpy(char *buf,int buf_size,char *str)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  if (0 < buf_size) {
    pcVar1 = buf + ((ulong)(uint)buf_size - 1);
    cVar2 = *str;
    if (buf < pcVar1 && cVar2 != '\0') {
      pcVar3 = str + 1;
      do {
        *buf = cVar2;
        buf = buf + 1;
        cVar2 = *pcVar3;
        if (cVar2 == '\0') break;
        pcVar3 = pcVar3 + 1;
      } while (buf < pcVar1);
    }
    *buf = '\0';
  }
  return;
}

Assistant:

void pstrcpy(char *buf, int buf_size, const char *str)
{
    int c;
    char *q = buf;

    if (buf_size <= 0)
        return;

    for(;;) {
        c = *str++;
        if (c == 0 || q >= buf + buf_size - 1)
            break;
        *q++ = c;
    }
    *q = '\0';
}